

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall ncnn::CpuSet::num_enabled(CpuSet *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  long lVar3;
  
  uVar1 = 0;
  iVar4 = 0;
  iVar5 = 0;
  auVar2 = _DAT_003152d0;
  do {
    uVar9 = (this->cpu_set).__bits[uVar1 >> 6];
    auVar7 = auVar2 & _DAT_00315d80;
    auVar8._8_4_ = auVar7._8_4_;
    auVar8._12_4_ = auVar7._12_4_;
    auVar8._0_8_ = auVar7._8_8_;
    auVar6._8_4_ = (int)uVar9;
    auVar6._0_8_ = uVar9;
    auVar6._12_4_ = (int)(uVar9 >> 0x20);
    uVar9 = 1L << auVar7._0_8_ & uVar9;
    uVar10 = 1L << auVar8._8_8_ & auVar6._8_8_;
    iVar4 = (iVar4 - (uint)((int)uVar9 == 0 && (int)(uVar9 >> 0x20) == 0)) + 1;
    iVar5 = (iVar5 - (uint)((int)uVar10 == 0 && (int)(uVar10 >> 0x20) == 0)) + 1;
    uVar1 = uVar1 + 2;
    lVar3 = auVar2._8_8_;
    auVar2._0_8_ = auVar2._0_8_ + 2;
    auVar2._8_8_ = lVar3 + 2;
  } while (uVar1 != 0x400);
  return iVar5 + iVar4;
}

Assistant:

int CpuSet::num_enabled() const
{
    int num_enabled = 0;
    for (int i = 0; i < (int)sizeof(cpu_set_t) * 8; i++)
    {
        if (is_enabled(i))
            num_enabled++;
    }

    return num_enabled;
}